

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O0

void __thiscall bgui::BaseWindow::BaseWindow(BaseWindow *this,char *title,int w,int h)

{
  int iVar1;
  undefined8 uVar2;
  void *pvVar3;
  int *piVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  ulong uVar7;
  string *message;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  XWindowAttributes wattr;
  XTextProperty iconname;
  XTextProperty windowname;
  XClassHint *class_hints;
  XWMHints *wm_hints;
  XSizeHints *size_hints;
  int maxh;
  int maxw;
  undefined8 in_stack_fffffffffffffcb8;
  uint uVar9;
  undefined8 *puVar8;
  undefined4 uVar10;
  BaseWindowData *in_stack_fffffffffffffcc0;
  undefined8 *puVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  string *in_stack_fffffffffffffcf8;
  X11Exception *in_stack_fffffffffffffd00;
  allocator *this_00;
  allocator local_271;
  string local_270 [38];
  undefined1 local_24a;
  allocator local_249;
  string local_248 [38];
  undefined1 local_222;
  allocator local_221;
  string local_220 [32];
  undefined1 local_200 [20];
  undefined4 local_1ec;
  undefined8 local_1e8;
  undefined1 local_172;
  allocator local_171;
  string local_170 [38];
  undefined1 local_14a;
  allocator local_149;
  string local_148 [38];
  undefined1 local_122;
  allocator local_121;
  string local_120 [38];
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  undefined8 local_d8 [4];
  undefined8 local_b8 [4];
  undefined8 *local_98;
  undefined8 *local_90;
  undefined8 *local_88;
  int local_7c;
  int local_78;
  undefined1 local_72;
  allocator local_71;
  string local_70 [35];
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  int local_18;
  int local_14;
  undefined8 local_10 [2];
  
  uVar9 = (uint)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
  *in_RDI = &PTR__BaseWindow_00146bb0;
  local_10[0] = in_RSI;
  if (((anonymous_namespace)::initx & 1) == 0) {
    (anonymous_namespace)::initx = 1;
    iVar1 = XInitThreads();
    if (iVar1 == 0) {
      local_4d = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,"Cannot initialize XLib for multi-threading",&local_39);
      anon_unknown_0::X11Exception::X11Exception
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      local_4d = 0;
      __cxa_throw(uVar2,&(anonymous_namespace)::X11Exception::typeinfo,
                  anon_unknown_0::X11Exception::~X11Exception);
    }
  }
  pvVar3 = operator_new(0xd8);
  memset(pvVar3,0,0xd8);
  BaseWindowData::BaseWindowData(in_stack_fffffffffffffcc0);
  in_RDI[1] = pvVar3;
  *(undefined8 **)in_RDI[1] = in_RDI;
  uVar2 = XOpenDisplay(0);
  *(undefined8 *)(in_RDI[1] + 8) = uVar2;
  if (*(long *)(in_RDI[1] + 8) == 0) {
    pvVar3 = (void *)in_RDI[1];
    if (pvVar3 != (void *)0x0) {
      BaseWindowData::~BaseWindowData(in_stack_fffffffffffffcc0);
      operator_delete(pvVar3);
    }
    local_72 = 1;
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Cannot connect to X display",&local_71);
    anon_unknown_0::X11Exception::X11Exception(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    local_72 = 0;
    __cxa_throw(uVar2,&(anonymous_namespace)::X11Exception::typeinfo,
                anon_unknown_0::X11Exception::~X11Exception);
  }
  *(undefined4 *)(in_RDI[1] + 0x10) = *(undefined4 *)(*(long *)(in_RDI[1] + 8) + 0xe0);
  local_78 = *(int *)(*(long *)(*(long *)(in_RDI[1] + 8) + 0xe8) +
                      (long)*(int *)(in_RDI[1] + 0x10) * 0x80 + 0x18);
  local_7c = *(int *)(*(long *)(*(long *)(in_RDI[1] + 8) + 0xe8) +
                      (long)*(int *)(in_RDI[1] + 0x10) * 0x80 + 0x1c);
  piVar4 = std::min<int>(&local_14,&local_78);
  local_14 = *piVar4;
  *(int *)(in_RDI[1] + 0x48) = local_14;
  piVar4 = std::min<int>(&local_18,&local_7c);
  local_18 = *piVar4;
  *(int *)(in_RDI[1] + 0x4c) = local_18;
  uVar2 = XCreateSimpleWindow(*(undefined8 *)(in_RDI[1] + 8),
                              *(undefined8 *)
                               (*(long *)(*(long *)(in_RDI[1] + 8) + 0xe8) +
                                (long)*(int *)(in_RDI[1] + 0x10) * 0x80 + 0x10),0,0,local_14,
                              local_18,(ulong)uVar9 << 0x20,
                              *(undefined8 *)
                               (*(long *)(*(long *)(in_RDI[1] + 8) + 0xe8) +
                                (long)*(int *)(in_RDI[1] + 0x10) * 0x80 + 0x60),
                              *(undefined8 *)
                               (*(long *)(*(long *)(in_RDI[1] + 8) + 0xe8) +
                                (long)*(int *)(in_RDI[1] + 0x10) * 0x80 + 0x58));
  *(undefined8 *)(in_RDI[1] + 0x18) = uVar2;
  XSetWindowBackgroundPixmap(*(undefined8 *)(in_RDI[1] + 8),*(undefined8 *)(in_RDI[1] + 0x18),0);
  memset(local_b8,0,0x20);
  memset(local_d8,0,0x20);
  iVar1 = XStringListToTextProperty(local_10,1,local_b8);
  if (iVar1 == 0) {
    local_fa = 1;
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"Allocation for title failed",&local_f9);
    anon_unknown_0::X11Exception::X11Exception(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    local_fa = 0;
    __cxa_throw(uVar2,&(anonymous_namespace)::X11Exception::typeinfo,
                anon_unknown_0::X11Exception::~X11Exception);
  }
  iVar1 = XStringListToTextProperty(local_10,1,local_d8);
  if (iVar1 != 0) {
    local_88 = (undefined8 *)XAllocSizeHints();
    local_90 = (undefined8 *)XAllocWMHints();
    puVar5 = (undefined8 *)XAllocClassHint();
    local_98 = puVar5;
    if (((local_88 == (undefined8 *)0x0) || (local_90 == (undefined8 *)0x0)) ||
       (puVar5 == (undefined8 *)0x0)) {
      local_14a = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"Allocation failed",&local_149);
      anon_unknown_0::X11Exception::X11Exception
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      local_14a = 0;
      __cxa_throw(uVar2,&(anonymous_namespace)::X11Exception::typeinfo,
                  anon_unknown_0::X11Exception::~X11Exception);
    }
    *local_88 = 0x38;
    *(undefined4 *)(local_88 + 3) = 10;
    *(undefined4 *)((long)local_88 + 0x1c) = 10;
    *(int *)(local_88 + 4) = local_78;
    *(int *)((long)local_88 + 0x24) = local_7c;
    *local_90 = 3;
    *(undefined4 *)((long)local_90 + 0xc) = 1;
    *(undefined4 *)(local_90 + 1) = 1;
    *puVar5 = "bwindow";
    puVar5[1] = local_10[0];
    puVar8 = local_88;
    puVar11 = local_90;
    XSetWMProperties(*(undefined8 *)(in_RDI[1] + 8),*(undefined8 *)(in_RDI[1] + 0x18),local_b8,
                     local_d8,0,0,local_88,local_90,puVar5);
    uVar13 = (undefined4)((ulong)puVar5 >> 0x20);
    uVar12 = (undefined4)((ulong)puVar11 >> 0x20);
    uVar10 = (undefined4)((ulong)puVar8 >> 0x20);
    XFree(local_88);
    XFree(local_90);
    XFree(local_98);
    XFree(local_b8[0]);
    XFree(local_d8[0]);
    uVar2 = XInternAtom(*(undefined8 *)(in_RDI[1] + 8),"WM_DELETE_WINDOW",0);
    *(undefined8 *)(in_RDI[1] + 0x28) = uVar2;
    iVar1 = XSetWMProtocols(*(undefined8 *)(in_RDI[1] + 8),*(undefined8 *)(in_RDI[1] + 0x18),
                            in_RDI[1] + 0x28,1);
    if (iVar1 == 0) {
      local_172 = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"Cannot set WM protocol",&local_171);
      anon_unknown_0::X11Exception::X11Exception
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      local_172 = 0;
      __cxa_throw(uVar2,&(anonymous_namespace)::X11Exception::typeinfo,
                  anon_unknown_0::X11Exception::~X11Exception);
    }
    *(undefined8 *)(in_RDI[1] + 0x20) = 0x2a00d;
    XSelectInput(*(undefined8 *)(in_RDI[1] + 8),*(undefined8 *)(in_RDI[1] + 0x18),
                 *(undefined8 *)(in_RDI[1] + 0x20));
    uVar2 = XCreateGC(*(undefined8 *)(in_RDI[1] + 8),*(undefined8 *)(in_RDI[1] + 0x18),0);
    *(undefined8 *)(in_RDI[1] + 0x30) = uVar2;
    XSetBackground(*(undefined8 *)(in_RDI[1] + 8),*(undefined8 *)(in_RDI[1] + 0x30),
                   *(undefined8 *)
                    (*(long *)(*(long *)(in_RDI[1] + 8) + 0xe8) +
                     (long)*(int *)(in_RDI[1] + 0x10) * 0x80 + 0x60));
    XSetForeground(*(undefined8 *)(in_RDI[1] + 8),*(undefined8 *)(in_RDI[1] + 0x30),
                   *(undefined8 *)
                    (*(long *)(*(long *)(in_RDI[1] + 8) + 0xe8) +
                     (long)*(int *)(in_RDI[1] + 0x10) * 0x80 + 0x58));
    uVar2 = *(undefined8 *)(in_RDI[1] + 8);
    uVar6 = XGContextFromGC(*(undefined8 *)(in_RDI[1] + 0x30));
    uVar2 = XQueryFont(uVar2,uVar6);
    *(undefined8 *)(in_RDI[1] + 0x38) = uVar2;
    XGetWindowAttributes(*(undefined8 *)(in_RDI[1] + 8),*(undefined8 *)(in_RDI[1] + 0x18),local_200)
    ;
    uVar2 = XCreateImage(*(undefined8 *)(in_RDI[1] + 8),local_1e8,local_1ec,2,0,0,
                         CONCAT44(uVar10,local_78),CONCAT44(uVar12,local_7c),CONCAT44(uVar13,8),0);
    *(undefined8 *)(in_RDI[1] + 0x40) = uVar2;
    uVar7 = gutil::isMSBFirst();
    if ((uVar7 & 1) == 0) {
      *(undefined4 *)(*(long *)(in_RDI[1] + 0x40) + 0x18) = 0;
    }
    else {
      *(undefined4 *)(*(long *)(in_RDI[1] + 0x40) + 0x18) = 1;
    }
    if (*(long *)(in_RDI[1] + 0x40) != 0) {
      pvVar3 = calloc((long)(*(int *)(*(long *)(in_RDI[1] + 0x40) + 0x2c) *
                            *(int *)(*(long *)(in_RDI[1] + 0x40) + 4)),1);
      *(void **)(*(long *)(in_RDI[1] + 0x40) + 0x10) = pvVar3;
    }
    if ((*(long *)(in_RDI[1] + 0x40) != 0) && (*(long *)(*(long *)(in_RDI[1] + 0x40) + 0x10) != 0))
    {
      *(undefined4 *)(in_RDI[1] + 0x50) = 0;
      iVar1 = pthread_mutex_init((pthread_mutex_t *)(in_RDI[1] + 0xa0),(pthread_mutexattr_t *)0x0);
      if (iVar1 != 0) {
        local_24a = 1;
        uVar2 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_248,"Cannot initialize mutex",&local_249);
        anon_unknown_0::X11Exception::X11Exception
                  (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
        local_24a = 0;
        __cxa_throw(uVar2,&(anonymous_namespace)::X11Exception::typeinfo,
                    anon_unknown_0::X11Exception::~X11Exception);
      }
      iVar1 = pthread_create((pthread_t *)(in_RDI[1] + 200),(pthread_attr_t *)0x0,
                             anon_unknown_0::eventLoop,(void *)in_RDI[1]);
      if (iVar1 != 0) {
        uVar2 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_270,"Cannot create event thread",&local_271);
        anon_unknown_0::X11Exception::X11Exception
                  (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
        __cxa_throw(uVar2,&(anonymous_namespace)::X11Exception::typeinfo,
                    anon_unknown_0::X11Exception::~X11Exception);
      }
      *(undefined1 *)(in_RDI[1] + 0xd0) = 1;
      return;
    }
    local_222 = 1;
    message = (string *)__cxa_allocate_exception(0x28);
    this_00 = &local_221;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"Allocation of image failed",this_00);
    anon_unknown_0::X11Exception::X11Exception((X11Exception *)this_00,message);
    local_222 = 0;
    __cxa_throw(message,&(anonymous_namespace)::X11Exception::typeinfo,
                anon_unknown_0::X11Exception::~X11Exception);
  }
  local_122 = 1;
  uVar2 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"Allocation for icon name failed",&local_121);
  anon_unknown_0::X11Exception::X11Exception(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  local_122 = 0;
  __cxa_throw(uVar2,&(anonymous_namespace)::X11Exception::typeinfo,
              anon_unknown_0::X11Exception::~X11Exception);
}

Assistant:

BaseWindow::BaseWindow(const char *title, int w, int h)
{
  // set multi-threading

  if (!initx)
  {
    initx=true;

    if (XInitThreads() == 0)
    {
      throw X11Exception("Cannot initialize XLib for multi-threading");
    }
  }

  // allocate memory

  p=new BaseWindowData();
  p->parent=this;

  // connect to X server

  p->display=XOpenDisplay(0);

  if (p->display == 0)
  {
    delete p;
    throw X11Exception("Cannot connect to X display");
  }

  // limit window size to display size

  p->screen=DefaultScreen(p->display);
  int maxw=DisplayWidth(p->display, p->screen);
  int maxh=DisplayHeight(p->display, p->screen);

  p->w=w=std::min(w, maxw);
  p->h=h=std::min(h, maxh);

  // create window

  p->window=XCreateSimpleWindow(p->display,
                                RootWindow(p->display, p->screen),
                                0, 0, w, h, 0,
                                BlackPixel(p->display, p->screen),
                                WhitePixel(p->display, p->screen));

  XSetWindowBackgroundPixmap(p->display, p->window, None);

  // set hints

  {
    XSizeHints    *size_hints;
    XWMHints      *wm_hints;
    XClassHint    *class_hints;
    XTextProperty windowname, iconname;

    memset(&windowname, 0, sizeof(XTextProperty));
    memset(&iconname, 0, sizeof(XTextProperty));

    if (XStringListToTextProperty(const_cast<char **>(&title), 1, &windowname) == 0)
    {
      throw X11Exception("Allocation for title failed");
    }

    if (XStringListToTextProperty(const_cast<char **>(&title), 1, &iconname) == 0)
    {
      throw X11Exception("Allocation for icon name failed");
    }

    size_hints=XAllocSizeHints();
    wm_hints=XAllocWMHints();
    class_hints=XAllocClassHint();

    if (size_hints == 0 || wm_hints == 0 || class_hints == 0)
    {
      throw X11Exception("Allocation failed");
    }

    size_hints->flags=PSize | PMinSize | PMaxSize;
    size_hints->min_width=10;
    size_hints->min_height=10;
    size_hints->max_width=maxw;
    size_hints->max_height=maxh;

    wm_hints->flags=StateHint | InputHint;
    wm_hints->initial_state=NormalState;
    wm_hints->input=True;

    class_hints->res_name=const_cast<char *>("bwindow");
    class_hints->res_class=const_cast<char *>(title);

    XSetWMProperties(p->display, p->window, &windowname, &iconname,
                     0, 0, size_hints, wm_hints, class_hints);

    XFree(size_hints);
    XFree(wm_hints);
    XFree(class_hints);
    XFree(windowname.value);
    XFree(iconname.value);
  }

  p->wm_delete_window=XInternAtom(p->display, "WM_DELETE_WINDOW", False);

  if (XSetWMProtocols(p->display, p->window, &(p->wm_delete_window), 1) == 0)
  {
    throw X11Exception("Cannot set WM protocol");
  }

  // set event mask

  p->event_mask=ExposureMask|StructureNotifyMask|ButtonPressMask|
                ButtonReleaseMask|ButtonMotionMask|KeyPressMask;

  XSelectInput(p->display, p->window, p->event_mask);

  // create graphics context

  p->gc=XCreateGC(p->display, p->window, 0, 0);

  XSetBackground(p->display, p->gc, BlackPixel(p->display, p->screen));
  XSetForeground(p->display, p->gc, WhitePixel(p->display, p->screen));

  p->font=XQueryFont(p->display, XGContextFromGC(p->gc));

  // create XImage buffer

  {
    XWindowAttributes wattr;

    XGetWindowAttributes(p->display, p->window, &wattr);

    p->image=XCreateImage(p->display, wattr.visual, wattr.depth, ZPixmap, 0,
                          0, maxw, maxh, 8, 0);

    if (gutil::isMSBFirst())
    {
      p->image->byte_order=MSBFirst;
    }
    else
    {
      p->image->byte_order=LSBFirst;
    }

    if (p->image != 0)
    {
      p->image->data=(char *) calloc(p->image->bytes_per_line*p->image->height, 1);
    }

    if (p->image == 0 || p->image->data == 0)
    {
      throw X11Exception("Allocation of image failed");
    }
  }

#ifdef INCLUDE_INOTIFY
  // initialise inotify pointer

  p->inotify_fd=0;
#endif

  // init mutex and start event loop

  if (pthread_mutex_init(&(p->mutex), 0) != 0)
  {
    throw X11Exception("Cannot initialize mutex");
  }

  if (pthread_create(&(p->thread), 0, eventLoop, p) == 0)
  {
    p->running=true;
  }
  else
  {
    throw X11Exception("Cannot create event thread");
  }
}